

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_char>,_QString>::~QStringBuilder
          (QStringBuilder<QStringBuilder<QStringBuilder<QString,_QString>,_char>,_QString> *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->b).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->b).d.d)->super_QArrayData,2,0x10);
    }
  }
  QStringBuilder<QString,_QString>::~QStringBuilder((QStringBuilder<QString,_QString> *)this);
  return;
}

Assistant:

~QStringBuilder() = default;